

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O2

void slang::
     function_ref<void(slang::ast::Compilation&,slang::ast::ClassType&,slang::SourceLocation)>::
     callback_fn<slang::ast::builtins::createMailboxClass(slang::ast::Compilation&)::__0>
               (intptr_t callable,Compilation *params,ClassType *params_1,SourceLocation params_2)

{
  Type *type;
  Type *retType;
  Symbol *pSVar1;
  Type *type_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  ClassBuilder builder;
  SVInt defaultZero;
  SVInt defaultOne;
  _Optional_payload_base<slang::SVInt> local_358;
  _Optional_payload_base<slang::SVInt> local_340;
  _Optional_payload_base<slang::SVInt> local_328;
  _Optional_payload_base<slang::SVInt> local_310;
  _Optional_payload_base<slang::SVInt> local_2f8;
  _Optional_payload_base<slang::SVInt> local_2e0;
  _Optional_payload_base<slang::SVInt> local_2c8;
  MethodBuilder ctor;
  MethodBuilder try_peek;
  MethodBuilder peek;
  MethodBuilder try_get;
  MethodBuilder get;
  MethodBuilder try_put;
  MethodBuilder put;
  MethodBuilder local_80;
  
  name._M_str = "T";
  name._M_len = 1;
  pSVar1 = ast::Scope::find(&params_1->super_Scope,name);
  type_00 = ast::DeclaredType::getType((DeclaredType *)&pSVar1[1].location);
  ast::ClassBuilder::ClassBuilder(&builder,params,params_1);
  type = params->intType;
  retType = params->voidType;
  SVInt::SVInt(&defaultZero,0x20,0,true);
  SVInt::SVInt(&defaultOne,0x20,1,true);
  name_07._M_str = "new";
  name_07._M_len = 3;
  ast::ClassBuilder::addMethod(&ctor,&builder,name_07,retType,Function);
  ast::MethodBuilder::addFlags(&ctor,(bitmask<slang::ast::MethodFlags>)0x8);
  std::_Optional_payload_base<slang::SVInt>::_Optional_payload_base<slang::SVInt&>
            (&local_358,&defaultZero);
  name_00._M_str = "bound";
  name_00._M_len = 5;
  ast::MethodBuilder::addArg(&ctor,name_00,type,In,(optional<slang::SVInt> *)&local_358);
  std::_Optional_payload_base<slang::SVInt>::_M_reset(&local_358);
  name_08._M_str = "num";
  name_08._M_len = 3;
  ast::ClassBuilder::addMethod(&local_80,&builder,name_08,type,Function);
  ast::MethodBuilder::~MethodBuilder(&local_80);
  name_09._M_str = "put";
  name_09._M_len = 3;
  ast::ClassBuilder::addMethod(&put,&builder,name_09,retType,Task);
  local_2c8._M_engaged = false;
  name_01._M_str = "message";
  name_01._M_len = 7;
  ast::MethodBuilder::addArg(&put,name_01,type_00,In,(optional<slang::SVInt> *)&local_2c8);
  std::_Optional_payload_base<slang::SVInt>::_M_reset(&local_2c8);
  name_10._M_str = "try_put";
  name_10._M_len = 7;
  ast::ClassBuilder::addMethod(&try_put,&builder,name_10,type,Function);
  local_2e0._M_engaged = false;
  name_02._M_str = "message";
  name_02._M_len = 7;
  ast::MethodBuilder::addArg(&try_put,name_02,type_00,In,(optional<slang::SVInt> *)&local_2e0);
  std::_Optional_payload_base<slang::SVInt>::_M_reset(&local_2e0);
  name_11._M_str = "get";
  name_11._M_len = 3;
  ast::ClassBuilder::addMethod(&get,&builder,name_11,retType,Task);
  local_2f8._M_engaged = false;
  name_03._M_str = "message";
  name_03._M_len = 7;
  ast::MethodBuilder::addArg(&get,name_03,type_00,Ref,(optional<slang::SVInt> *)&local_2f8);
  std::_Optional_payload_base<slang::SVInt>::_M_reset(&local_2f8);
  name_12._M_str = "try_get";
  name_12._M_len = 7;
  ast::ClassBuilder::addMethod(&try_get,&builder,name_12,type,Function);
  local_310._M_engaged = false;
  name_04._M_str = "message";
  name_04._M_len = 7;
  ast::MethodBuilder::addArg(&try_get,name_04,type_00,Ref,(optional<slang::SVInt> *)&local_310);
  std::_Optional_payload_base<slang::SVInt>::_M_reset(&local_310);
  name_13._M_str = "peek";
  name_13._M_len = 4;
  ast::ClassBuilder::addMethod(&peek,&builder,name_13,retType,Task);
  local_328._M_engaged = false;
  name_05._M_str = "message";
  name_05._M_len = 7;
  ast::MethodBuilder::addArg(&peek,name_05,type_00,Ref,(optional<slang::SVInt> *)&local_328);
  std::_Optional_payload_base<slang::SVInt>::_M_reset(&local_328);
  name_14._M_str = "try_peek";
  name_14._M_len = 8;
  ast::ClassBuilder::addMethod(&try_peek,&builder,name_14,type,Function);
  local_340._M_engaged = false;
  name_06._M_str = "message";
  name_06._M_len = 7;
  ast::MethodBuilder::addArg(&try_peek,name_06,type_00,Ref,(optional<slang::SVInt> *)&local_340);
  std::_Optional_payload_base<slang::SVInt>::_M_reset(&local_340);
  ast::MethodBuilder::~MethodBuilder(&try_peek);
  ast::MethodBuilder::~MethodBuilder(&peek);
  ast::MethodBuilder::~MethodBuilder(&try_get);
  ast::MethodBuilder::~MethodBuilder(&get);
  ast::MethodBuilder::~MethodBuilder(&try_put);
  ast::MethodBuilder::~MethodBuilder(&put);
  ast::MethodBuilder::~MethodBuilder(&ctor);
  SVInt::~SVInt(&defaultOne);
  SVInt::~SVInt(&defaultZero);
  return;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params... params) {
        return (*reinterpret_cast<Callable*>(callable))(std::forward<Params>(params)...);
    }